

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O1

size_t __thiscall
avro::parsing::
ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>::
skipArray(ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>
          *this)

{
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *this_00;
  int iVar1;
  undefined4 extraout_var;
  
  this_00 = &this->parser_;
  SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance(this_00,sArrayStart);
  iVar1 = (*((this->base_).px)->_vptr_Decoder[0x12])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
              (&(this->parser_).parsingStack.c);
  }
  else {
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::setRepeatCount
              (this_00,CONCAT44(extraout_var,iVar1));
    SimpleParser<avro::parsing::ResolvingDecoderHandler>::skip(this_00,(this->base_).px);
  }
  SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance(this_00,sArrayEnd);
  return 0;
}

Assistant:

size_t ResolvingDecoderImpl<P>::skipArray()
{
    parser_.advance(Symbol::sArrayStart);
    size_t n = base_->skipArray();
    if (n == 0) {
        parser_.pop();
    } else {
        parser_.setRepeatCount(n);
        parser_.skip(*base_);
    }
    parser_.advance(Symbol::sArrayEnd);
    return 0;
}